

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMoveSrEa<(moira::Instr)75,(moira::Mode)5,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  Ea<(moira::Mode)5,_2> dst;
  u32 local_1c;
  ushort local_18;
  uint local_14;
  
  local_18 = op & 7;
  local_1c = *addr;
  *addr = local_1c + 2;
  local_14 = (*this->_vptr_Moira[6])();
  local_14 = local_14 & 0xffff;
  if (str->style->syntax == MUSASHI) {
    cVar4 = 'm';
    lVar5 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "fdmove"[lVar5 + 3];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
      goto LAB_00240fe5;
    }
  }
  else {
    cVar4 = 'm';
    lVar5 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "fdmove"[lVar5 + 3];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = 'w';
    }
    else {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = "$%x.w"[lVar5 + 4];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
      goto LAB_00240fe5;
    }
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ' ';
LAB_00240fe5:
  StrWriter::operator<<(str);
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)5,_2> *)&local_1c);
  return;
}

Assistant:

void
Moira::dasmMoveSrEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Op<M, S>( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Sr{} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Sr{} << Sep{} << dst;
    }
}